

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O3

void __thiscall binlog::EventStream::readEvent(EventStream *this,uint64_t eventSourceId,Range range)

{
  mapped_type *pmVar1;
  runtime_error *this_00;
  uint64_t local_70;
  string local_68;
  Range local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_48._end = range._end;
  local_48._begin = range._begin;
  local_70 = eventSourceId;
  pmVar1 = detail::SegmentedMap<binlog::EventSource>::find(&this->_eventSources,&local_70);
  if (pmVar1 != (mapped_type *)0x0) {
    (this->_event).source = pmVar1;
    Range::throw_if_overflow(&local_48,8);
    (this->_event).clockValue = *(uint64_t *)local_48._begin;
    (this->_event).arguments._begin = (char *)((long)local_48._begin + 8);
    (this->_event).arguments._end = local_48._end;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_68,local_70);
  std::operator+(&local_38,"Event has invalid source id: ",&local_68);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void EventStream::readEvent(std::uint64_t eventSourceId, Range range)
{
  auto&& it = _eventSources.find(eventSourceId);
  if (it == _eventSources.end())
  {
    throw std::runtime_error("Event has invalid source id: " + std::to_string(eventSourceId));
  }

  _event.source = it;
  _event.clockValue = range.read<std::uint64_t>();
  _event.arguments = range;
}